

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticType.cpp
# Opt level: O0

StaticType *
Js::StaticType::New(ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
                   JavascriptMethod entryPoint)

{
  Recycler *pRVar1;
  StaticType *this;
  TrackAllocData local_50;
  JavascriptMethod local_28;
  JavascriptMethod entryPoint_local;
  RecyclableObject *prototype_local;
  ScriptContext *pSStack_10;
  TypeId typeId_local;
  ScriptContext *scriptContext_local;
  
  local_28 = entryPoint;
  entryPoint_local = (JavascriptMethod)prototype;
  prototype_local._4_4_ = typeId;
  pSStack_10 = scriptContext;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/StaticType.cpp"
             ,0xc);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this = (StaticType *)new<Memory::Recycler>(0x28,pRVar1,0x43c4b0);
  StaticType(this,pSStack_10,prototype_local._4_4_,(RecyclableObject *)entryPoint_local,local_28);
  return this;
}

Assistant:

StaticType *
    StaticType::New(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint)
    {
        return RecyclerNew(scriptContext->GetRecycler(), StaticType, scriptContext, typeId, prototype, entryPoint);
    }